

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O3

void wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::scan
               (CodePushing *self,Expression **currp)

{
  char *__function;
  Expression *currp_00;
  Expression *pEVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_> *pPVar5;
  _func_void_CodePushing_ptr_Expression_ptr_ptr *local_40;
  Expression *local_38;
  
  pEVar1 = *currp;
  switch(pEVar1->_id) {
  case InvalidId:
  case NumExpressionIds:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-delegations-fields.def"
                       ,0xb0);
  case BlockId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
              ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>;
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&pPVar5->super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitBlock,
               currp);
    if (pEVar1->_id != BlockId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Block]";
LAB_00686b31:
      __assert_fail("int(_id) == int(T::SpecificId)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm.h"
                    ,0x314,__function);
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[2].type.id <= uVar3 - 2) {
LAB_006867ce:
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
                  (&pPVar5->super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>
                   ,scan,(Expression **)(*(long *)(pEVar1 + 2) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case IfId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
              ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>;
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&pPVar5->super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitIf,currp);
    if (pEVar1->_id != IfId) {
      __function = "T *wasm::Expression::cast() [T = wasm::If]";
      goto LAB_00686b31;
    }
    local_38 = pEVar1 + 2;
    local_40 = scan;
    if (*(long *)(pEVar1 + 2) != 0) {
      SmallVector<wasm::Walker<wasm::CodePushing,wasm::Visitor<wasm::CodePushing,void>>::Task,10ul>
      ::emplace_back<void(*&)(wasm::CodePushing*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::CodePushing,wasm::Visitor<wasm::CodePushing,void>>::Task,10ul>
                  *)&(self->
                     super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                     ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                     super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.stack,
                 &local_40,(Expression ***)&local_38);
    }
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&pPVar5->super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               scan,(Expression **)&pEVar1[1].type);
    pEVar1 = pEVar1 + 1;
    goto LAB_006867b7;
  case LoopId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitLoop,currp
              );
    if (pEVar1->_id != LoopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Loop]";
      goto LAB_00686b31;
    }
    goto LAB_00686358;
  case BreakId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitBreak,
               currp);
    if (pEVar1->_id != BreakId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Break]";
      goto LAB_00686b31;
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = scan;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::CodePushing,wasm::Visitor<wasm::CodePushing,void>>::Task,10ul>
      ::emplace_back<void(*&)(wasm::CodePushing*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::CodePushing,wasm::Visitor<wasm::CodePushing,void>>::Task,10ul>
                  *)&(self->
                     super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                     ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                     super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.stack,
                 &local_40,(Expression ***)&local_38);
    }
    local_38 = pEVar1 + 2;
    if (*(long *)(pEVar1 + 2) == 0) {
      return;
    }
    goto LAB_00685f6d;
  case SwitchId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
              ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>;
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&pPVar5->super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitSwitch,
               currp);
    if (pEVar1->_id != SwitchId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Switch]";
      goto LAB_00686b31;
    }
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&pPVar5->super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               scan,(Expression **)&pEVar1[4].type);
    local_38 = pEVar1 + 4;
    lVar4 = *(long *)(pEVar1 + 4);
    goto joined_r0x00685cfb;
  case CallId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
              ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>;
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&pPVar5->super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitCall,currp
              );
    if (pEVar1->_id != CallId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Call]";
      goto LAB_00686b31;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_006867ce;
        Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
                  (&pPVar5->super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>
                   ,scan,(Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case CallIndirectId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
              ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>;
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&pPVar5->super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::
               doVisitCallIndirect,currp);
    if (pEVar1->_id != CallIndirectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallIndirect]";
      goto LAB_00686b31;
    }
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&pPVar5->super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               scan,(Expression **)&pEVar1[3].type);
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 2)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 2) & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (*(ulong *)(pEVar1 + 2) <= uVar3 - 2) goto LAB_006867ce;
        Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
                  (&pPVar5->super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>
                   ,scan,(Expression **)(pEVar1[1].type.id + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case LocalGetId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitLocalGet,
               currp);
    if (pEVar1->_id != LocalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalGet]";
      goto LAB_00686b31;
    }
    break;
  case LocalSetId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitLocalSet,
               currp);
    if (pEVar1->_id != LocalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalSet]";
      goto LAB_00686b31;
    }
    goto LAB_0068645a;
  case GlobalGetId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitGlobalGet,
               currp);
    if (pEVar1->_id != GlobalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalGet]";
      goto LAB_00686b31;
    }
    break;
  case GlobalSetId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitGlobalSet,
               currp);
    if (pEVar1->_id != GlobalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalSet]";
      goto LAB_00686b31;
    }
    goto LAB_00686358;
  case LoadId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitLoad,currp
              );
    if (pEVar1->_id != LoadId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Load]";
      goto LAB_00686b31;
    }
    pEVar1 = pEVar1 + 3;
    goto LAB_00686701;
  case StoreId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitStore,
               currp);
    if (pEVar1->_id != StoreId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Store]";
      goto LAB_00686b31;
    }
    goto LAB_0068641f;
  case ConstId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitConst,
               currp);
    if (pEVar1->_id != ConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Const]";
      goto LAB_00686b31;
    }
    break;
  case UnaryId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitUnary,
               currp);
    if (pEVar1->_id != UnaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unary]";
      goto LAB_00686b31;
    }
    goto LAB_0068645a;
  case BinaryId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitBinary,
               currp);
    if (pEVar1->_id != BinaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Binary]";
      goto LAB_00686b31;
    }
    goto LAB_006866e1;
  case SelectId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitSelect,
               currp);
    if (pEVar1->_id != SelectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Select]";
      goto LAB_00686b31;
    }
    goto LAB_0068604c;
  case DropId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitDrop,currp
              );
    if (pEVar1->_id != DropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Drop]";
      goto LAB_00686b31;
    }
    goto LAB_006866b5;
  case ReturnId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitReturn,
               currp);
    if (pEVar1->_id != ReturnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Return]";
      goto LAB_00686b31;
    }
    goto LAB_00685cf2;
  case MemorySizeId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitMemorySize
               ,currp);
    if (pEVar1->_id != MemorySizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemorySize]";
      goto LAB_00686b31;
    }
    break;
  case MemoryGrowId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitMemoryGrow
               ,currp);
    if (pEVar1->_id != MemoryGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryGrow]";
      goto LAB_00686b31;
    }
    goto LAB_006866b5;
  case NopId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitNop,currp)
    ;
    if (pEVar1->_id != NopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Nop]";
      goto LAB_00686b31;
    }
    break;
  case UnreachableId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::
               doVisitUnreachable,currp);
    if (pEVar1->_id != UnreachableId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unreachable]";
      goto LAB_00686b31;
    }
    break;
  case AtomicRMWId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitAtomicRMW,
               currp);
    if (pEVar1->_id != AtomicRMWId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicRMW]";
      goto LAB_00686b31;
    }
    goto LAB_00686505;
  case AtomicCmpxchgId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::
               doVisitAtomicCmpxchg,currp);
    if (pEVar1->_id != AtomicCmpxchgId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicCmpxchg]";
      goto LAB_00686b31;
    }
    goto LAB_006864eb;
  case AtomicWaitId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitAtomicWait
               ,currp);
    if (pEVar1->_id != AtomicWaitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicWait]";
      goto LAB_00686b31;
    }
    goto LAB_00685b79;
  case AtomicNotifyId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::
               doVisitAtomicNotify,currp);
    if (pEVar1->_id != AtomicNotifyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicNotify]";
      goto LAB_00686b31;
    }
    goto LAB_006866e1;
  case AtomicFenceId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::
               doVisitAtomicFence,currp);
    if (pEVar1->_id != AtomicFenceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicFence]";
      goto LAB_00686b31;
    }
    break;
  case SIMDExtractId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::
               doVisitSIMDExtract,currp);
    if (pEVar1->_id != SIMDExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDExtract]";
      goto LAB_00686b31;
    }
    goto LAB_0068645a;
  case SIMDReplaceId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::
               doVisitSIMDReplace,currp);
    if (pEVar1->_id != SIMDReplaceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDReplace]";
      goto LAB_00686b31;
    }
    currp_00 = (Expression *)&pEVar1[2].type;
    goto LAB_006866ec;
  case SIMDShuffleId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::
               doVisitSIMDShuffle,currp);
    if (pEVar1->_id != SIMDShuffleId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShuffle]";
      goto LAB_00686b31;
    }
    goto LAB_00686653;
  case SIMDTernaryId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::
               doVisitSIMDTernary,currp);
    if (pEVar1->_id != SIMDTernaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDTernary]";
      goto LAB_00686b31;
    }
    goto LAB_00685b79;
  case SIMDShiftId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitSIMDShift,
               currp);
    if (pEVar1->_id != SIMDShiftId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShift]";
      goto LAB_00686b31;
    }
    goto LAB_006866e1;
  case SIMDLoadId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitSIMDLoad,
               currp);
    if (pEVar1->_id != SIMDLoadId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoad]";
      goto LAB_00686b31;
    }
    goto LAB_00686281;
  case SIMDLoadStoreLaneId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::
               doVisitSIMDLoadStoreLane,currp);
    if (pEVar1->_id != SIMDLoadStoreLaneId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoadStoreLane]";
      goto LAB_00686b31;
    }
LAB_0068641f:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,scan,
               (Expression **)&pEVar1[3].type);
    pEVar1 = pEVar1 + 3;
    goto LAB_00686701;
  case MemoryInitId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitMemoryInit
               ,currp);
    if (pEVar1->_id != MemoryInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryInit]";
      goto LAB_00686b31;
    }
LAB_006864eb:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,scan,
               (Expression **)(pEVar1 + 3));
    goto LAB_00686505;
  case DataDropId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitDataDrop,
               currp);
    if (pEVar1->_id != DataDropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::DataDrop]";
      goto LAB_00686b31;
    }
    break;
  case MemoryCopyId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitMemoryCopy
               ,currp);
    if (pEVar1->_id != MemoryCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryCopy]";
      goto LAB_00686b31;
    }
    goto LAB_0068604c;
  case MemoryFillId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitMemoryFill
               ,currp);
    if (pEVar1->_id != MemoryFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryFill]";
      goto LAB_00686b31;
    }
    goto LAB_0068604c;
  case PopId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitPop,currp)
    ;
    if (pEVar1->_id != PopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Pop]";
      goto LAB_00686b31;
    }
    break;
  case RefNullId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitRefNull,
               currp);
    if (pEVar1->_id != RefNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefNull]";
      goto LAB_00686b31;
    }
    break;
  case RefIsNullId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitRefIsNull,
               currp);
    if (pEVar1->_id != RefIsNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefIsNull]";
      goto LAB_00686b31;
    }
    goto LAB_006866b5;
  case RefFuncId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitRefFunc,
               currp);
    if (pEVar1->_id != RefFuncId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefFunc]";
      goto LAB_00686b31;
    }
    break;
  case RefEqId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitRefEq,
               currp);
    if (pEVar1->_id != RefEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefEq]";
      goto LAB_00686b31;
    }
    goto LAB_00686653;
  case TableGetId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitTableGet,
               currp);
    if (pEVar1->_id != TableGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGet]";
      goto LAB_00686b31;
    }
    goto LAB_00686358;
  case TableSetId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitTableSet,
               currp);
    if (pEVar1->_id != TableSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSet]";
      goto LAB_00686b31;
    }
    goto LAB_00686505;
  case TableSizeId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitTableSize,
               currp);
    if (pEVar1->_id != TableSizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSize]";
      goto LAB_00686b31;
    }
    break;
  case TableGrowId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitTableGrow,
               currp);
    if (pEVar1->_id != TableGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGrow]";
      goto LAB_00686b31;
    }
LAB_00686505:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,scan,
               (Expression **)&pEVar1[2].type);
    pEVar1 = pEVar1 + 2;
    goto LAB_00686701;
  case TryId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
              ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>;
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&pPVar5->super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitTry,currp)
    ;
    if (pEVar1->_id != TryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Try]";
      goto LAB_00686b31;
    }
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 5)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 5) & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (*(ulong *)(pEVar1 + 5) <= uVar3 - 2) goto LAB_006867ce;
        Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
                  (&pPVar5->super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>
                   ,scan,(Expression **)(pEVar1[4].type.id + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
LAB_00686358:
    pEVar1 = pEVar1 + 2;
    goto LAB_00686701;
  case ThrowId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
              ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>;
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&pPVar5->super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitThrow,
               currp);
    if (pEVar1->_id != ThrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Throw]";
      goto LAB_00686b31;
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[2].type.id <= uVar3 - 2) goto LAB_006867ce;
        Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
                  (&pPVar5->super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>
                   ,scan,(Expression **)(*(long *)(pEVar1 + 2) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case RethrowId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitRethrow,
               currp);
    if (pEVar1->_id != RethrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Rethrow]";
      goto LAB_00686b31;
    }
    break;
  case TupleMakeId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
              ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>;
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&pPVar5->super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitTupleMake,
               currp);
    if (pEVar1->_id != TupleMakeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleMake]";
      goto LAB_00686b31;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_006867ce;
        Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
                  (&pPVar5->super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>
                   ,scan,(Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case TupleExtractId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::
               doVisitTupleExtract,currp);
    if (pEVar1->_id != TupleExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleExtract]";
      goto LAB_00686b31;
    }
    goto LAB_006866b5;
  case I31NewId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitI31New,
               currp);
    if (pEVar1->_id != I31NewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::I31New]";
      goto LAB_00686b31;
    }
    goto LAB_006866b5;
  case I31GetId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitI31Get,
               currp);
    if (pEVar1->_id != I31GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::I31Get]";
      goto LAB_00686b31;
    }
    goto LAB_006866b5;
  case CallRefId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
              ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>;
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&pPVar5->super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitCallRef,
               currp);
    if (pEVar1->_id != CallRefId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallRef]";
      goto LAB_00686b31;
    }
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&pPVar5->super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               scan,(Expression **)(pEVar1 + 3));
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_006867ce;
        Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
                  (&pPVar5->super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>
                   ,scan,(Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case RefTestId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitRefTest,
               currp);
    if (pEVar1->_id != RefTestId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefTest]";
      goto LAB_00686b31;
    }
    goto LAB_006866b5;
  case RefCastId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitRefCast,
               currp);
    if (pEVar1->_id != RefCastId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefCast]";
      goto LAB_00686b31;
    }
    goto LAB_006866b5;
  case BrOnId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitBrOn,currp
              );
    if (pEVar1->_id != BrOnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::BrOn]";
      goto LAB_00686b31;
    }
LAB_00686281:
    pEVar1 = (Expression *)&pEVar1[2].type;
    goto LAB_00686701;
  case StructNewId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
              ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>;
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&pPVar5->super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitStructNew,
               currp);
    if (pEVar1->_id != StructNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructNew]";
      goto LAB_00686b31;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_006867ce;
        Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
                  (&pPVar5->super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>
                   ,scan,(Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case StructGetId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitStructGet,
               currp);
    if (pEVar1->_id != StructGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructGet]";
      goto LAB_00686b31;
    }
    goto LAB_0068645a;
  case StructSetId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitStructSet,
               currp);
    if (pEVar1->_id != StructSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructSet]";
      goto LAB_00686b31;
    }
    goto LAB_006866e1;
  case ArrayNewId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
              ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>;
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&pPVar5->super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitArrayNew,
               currp);
    if (pEVar1->_id != ArrayNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNew]";
      goto LAB_00686b31;
    }
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&pPVar5->super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               scan,(Expression **)&pEVar1[1].type);
LAB_00685cf2:
    local_38 = pEVar1 + 1;
    lVar4 = *(long *)(pEVar1 + 1);
joined_r0x00685cfb:
    if (lVar4 != 0) {
LAB_00685f6d:
      local_40 = scan;
      SmallVector<wasm::Walker<wasm::CodePushing,wasm::Visitor<wasm::CodePushing,void>>::Task,10ul>
      ::emplace_back<void(*&)(wasm::CodePushing*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::CodePushing,wasm::Visitor<wasm::CodePushing,void>>::Task,10ul>
                  *)&(self->
                     super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                     ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                     super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.stack,
                 &local_40,(Expression ***)&local_38);
    }
    break;
  case ArrayNewSegId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::
               doVisitArrayNewSeg,currp);
    if (pEVar1->_id != ArrayNewSegId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewSeg]";
      goto LAB_00686b31;
    }
    goto LAB_00685da2;
  case ArrayNewFixedId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
              ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>;
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&pPVar5->super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::
               doVisitArrayNewFixed,currp);
    if (pEVar1->_id != ArrayNewFixedId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewFixed]";
      goto LAB_00686b31;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_006867ce;
        Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
                  (&pPVar5->super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>
                   ,scan,(Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case ArrayGetId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitArrayGet,
               currp);
    if (pEVar1->_id != ArrayGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayGet]";
      goto LAB_00686b31;
    }
    goto LAB_00686653;
  case ArraySetId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitArraySet,
               currp);
    if (pEVar1->_id != ArraySetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArraySet]";
      goto LAB_00686b31;
    }
    goto LAB_0068604c;
  case ArrayLenId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitArrayLen,
               currp);
    if (pEVar1->_id != ArrayLenId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayLen]";
      goto LAB_00686b31;
    }
    goto LAB_006866b5;
  case ArrayCopyId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
              ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>;
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&pPVar5->super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitArrayCopy,
               currp);
    if (pEVar1->_id != ArrayCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayCopy]";
      goto LAB_00686b31;
    }
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&pPVar5->super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               scan,(Expression **)(pEVar1 + 3));
    goto LAB_00685b13;
  case ArrayFillId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitArrayFill,
               currp);
    if (pEVar1->_id != ArrayFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayFill]";
      goto LAB_00686b31;
    }
LAB_00685b13:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,scan,
               (Expression **)&pEVar1[2].type);
    goto LAB_0068604c;
  case ArrayInitId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
              ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>;
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&pPVar5->super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitArrayInit,
               currp);
    if (pEVar1->_id != ArrayInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayInit]";
      goto LAB_00686b31;
    }
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&pPVar5->super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               scan,(Expression **)(pEVar1 + 4));
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&pPVar5->super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               scan,(Expression **)&pEVar1[3].type);
LAB_00685da2:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,scan,
               (Expression **)(pEVar1 + 3));
    pEVar1 = (Expression *)&pEVar1[2].type;
    goto LAB_00686701;
  case RefAsId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitRefAs,
               currp);
    if (pEVar1->_id != RefAsId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefAs]";
      goto LAB_00686b31;
    }
    goto LAB_0068645a;
  case StringNewId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitStringNew,
               currp);
    if (pEVar1->_id != StringNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringNew]";
      goto LAB_00686b31;
    }
    local_38 = pEVar1 + 3;
    local_40 = scan;
    if (*(long *)(pEVar1 + 3) != 0) {
      SmallVector<wasm::Walker<wasm::CodePushing,wasm::Visitor<wasm::CodePushing,void>>::Task,10ul>
      ::emplace_back<void(*&)(wasm::CodePushing*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::CodePushing,wasm::Visitor<wasm::CodePushing,void>>::Task,10ul>
                  *)&(self->
                     super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                     ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                     super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.stack,
                 &local_40,(Expression ***)&local_38);
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = scan;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::CodePushing,wasm::Visitor<wasm::CodePushing,void>>::Task,10ul>
      ::emplace_back<void(*&)(wasm::CodePushing*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::CodePushing,wasm::Visitor<wasm::CodePushing,void>>::Task,10ul>
                  *)&(self->
                     super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                     ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                     super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.stack,
                 &local_40,(Expression ***)&local_38);
    }
    local_38 = pEVar1 + 2;
    local_40 = scan;
    if (*(long *)(pEVar1 + 2) != 0) {
      SmallVector<wasm::Walker<wasm::CodePushing,wasm::Visitor<wasm::CodePushing,void>>::Task,10ul>
      ::emplace_back<void(*&)(wasm::CodePushing*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::CodePushing,wasm::Visitor<wasm::CodePushing,void>>::Task,10ul>
                  *)&(self->
                     super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                     ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                     super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.stack,
                 &local_40,(Expression ***)&local_38);
    }
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_006867b7;
  case StringConstId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::
               doVisitStringConst,currp);
    if (pEVar1->_id != StringConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConst]";
      goto LAB_00686b31;
    }
    break;
  case StringMeasureId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::
               doVisitStringMeasure,currp);
    if (pEVar1->_id != StringMeasureId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringMeasure]";
      goto LAB_00686b31;
    }
    goto LAB_0068645a;
  case StringEncodeId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
              ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>;
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&pPVar5->super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::
               doVisitStringEncode,currp);
    if (pEVar1->_id != StringEncodeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringEncode]";
      goto LAB_00686b31;
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = scan;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::CodePushing,wasm::Visitor<wasm::CodePushing,void>>::Task,10ul>
      ::emplace_back<void(*&)(wasm::CodePushing*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::CodePushing,wasm::Visitor<wasm::CodePushing,void>>::Task,10ul>
                  *)&(self->
                     super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                     ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                     super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.stack,
                 &local_40,(Expression ***)&local_38);
    }
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&pPVar5->super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               scan,(Expression **)(pEVar1 + 2));
    pEVar1 = (Expression *)&pEVar1[1].type;
LAB_006867b7:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,scan,
               (Expression **)pEVar1);
    break;
  case StringConcatId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::
               doVisitStringConcat,currp);
    if (pEVar1->_id != StringConcatId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConcat]";
      goto LAB_00686b31;
    }
    goto LAB_00686653;
  case StringEqId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitStringEq,
               currp);
    if (pEVar1->_id != StringEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringEq]";
      goto LAB_00686b31;
    }
    goto LAB_006866e1;
  case StringAsId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::doVisitStringAs,
               currp);
    if (pEVar1->_id != StringAsId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringAs]";
      goto LAB_00686b31;
    }
LAB_0068645a:
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_00686701;
  case StringWTF8AdvanceId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::
               doVisitStringWTF8Advance,currp);
    if (pEVar1->_id != StringWTF8AdvanceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringWTF8Advance]";
      goto LAB_00686b31;
    }
LAB_0068604c:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,scan,
               (Expression **)(pEVar1 + 2));
    goto LAB_00686653;
  case StringWTF16GetId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::
               doVisitStringWTF16Get,currp);
    if (pEVar1->_id != StringWTF16GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringWTF16Get]";
      goto LAB_00686b31;
    }
    goto LAB_00686653;
  case StringIterNextId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::
               doVisitStringIterNext,currp);
    if (pEVar1->_id != StringIterNextId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringIterNext]";
      goto LAB_00686b31;
    }
LAB_006866b5:
    pEVar1 = pEVar1 + 1;
LAB_00686701:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,scan,
               (Expression **)pEVar1);
    return;
  case StringIterMoveId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::
               doVisitStringIterMove,currp);
    if (pEVar1->_id != StringIterMoveId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringIterMove]";
      goto LAB_00686b31;
    }
LAB_006866e1:
    currp_00 = pEVar1 + 2;
LAB_006866ec:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,scan,
               (Expression **)currp_00);
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_00686701;
  case StringSliceWTFId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::
               doVisitStringSliceWTF,currp);
    if (pEVar1->_id != StringSliceWTFId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringSliceWTF]";
      goto LAB_00686b31;
    }
LAB_00685b79:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,scan,
               (Expression **)&pEVar1[2].type);
    currp_00 = pEVar1 + 2;
    goto LAB_006866ec;
  case StringSliceIterId:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,
               Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::
               doVisitStringSliceIter,currp);
    if (pEVar1->_id != StringSliceIterId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringSliceIter]";
      goto LAB_00686b31;
    }
LAB_00686653:
    Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,scan,
               (Expression **)&pEVar1[1].type);
    pEVar1 = pEVar1 + 1;
    goto LAB_00686701;
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id)                                                     \
  self->pushTask(SubType::doVisit##id, currp);                                 \
  [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field)                                        \
  self->pushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  self->maybePushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_INT_ARRAY(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_NAME_VECTOR(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE_VECTOR(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }